

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

bool __thiscall
Js::ProbeContainer::InitializeLocation
          (ProbeContainer *this,InterpreterHaltState *pHaltState,bool fMatchWithCurrentScriptContext
          )

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ReferencedArenaAdapter *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  StringBuilder<Memory::ArenaAllocator> *this_01;
  DiagStackFrame **ppDVar6;
  TrackAllocData local_50;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_28;
  ArenaAllocator *pDiagArena;
  InterpreterHaltState *pIStack_18;
  bool fMatchWithCurrentScriptContext_local;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  pDiagArena._7_1_ = fMatchWithCurrentScriptContext;
  pIStack_18 = pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  if (this->debugManager == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0xc5,"(debugManager)","debugManager");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DebugManager::SetCurrentInterpreterLocation(this->debugManager,pIStack_18);
  this_00 = DebugManager::GetDiagnosticArena(this->debugManager);
  local_28 = &Memory::ReferencedArenaAdapter::Arena(this_00)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  UpdateFramePointers(this,(bool)(pDiagArena._7_1_ & 1),0);
  pAVar5 = local_28;
  pIStack_18->framePointers = this->framePointers;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&StringBuilder<Memory::ArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
             ,0xcc);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_50);
  this_01 = (StringBuilder<Memory::ArenaAllocator> *)
            new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar5,0x3f67b0);
  StringBuilder<Memory::ArenaAllocator>::StringBuilder(this_01,(ArenaAllocator *)local_28);
  pIStack_18->stringBuilder = this_01;
  iVar3 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Count
                    (pIStack_18->framePointers);
  if (0 < iVar3) {
    ppDVar6 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
              Peek(pIStack_18->framePointers,0);
    pIStack_18->topFrame = *ppDVar6;
    DiagStackFrame::SetIsTopFrame(pIStack_18->topFrame);
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::InitializeLocation (end): this=%p, pHaltState=%p, fMatch=%d, topFrame=%p\n"
                ,this,pIStack_18,(ulong)(pDiagArena._7_1_ & 1),pIStack_18->topFrame);
  return true;
}

Assistant:

bool ProbeContainer::InitializeLocation(InterpreterHaltState* pHaltState, bool fMatchWithCurrentScriptContext)
    {
        Assert(debugManager);
        debugManager->SetCurrentInterpreterLocation(pHaltState);

        ArenaAllocator* pDiagArena = debugManager->GetDiagnosticArena()->Arena();

        UpdateFramePointers(fMatchWithCurrentScriptContext);
        pHaltState->framePointers = framePointers;
        pHaltState->stringBuilder = Anew(pDiagArena, StringBuilder<ArenaAllocator>, pDiagArena);

        if (pHaltState->framePointers->Count() > 0)
        {
            pHaltState->topFrame = pHaltState->framePointers->Peek(0);
            pHaltState->topFrame->SetIsTopFrame();
        }

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::InitializeLocation (end): this=%p, pHaltState=%p, fMatch=%d, topFrame=%p\n"),
            this, pHaltState, fMatchWithCurrentScriptContext, pHaltState->topFrame);

        return true;
    }